

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockUnsizedStructArrayCase::init
          (BlockUnsizedStructArrayCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_> *this_00;
  ShaderInterface *this_01;
  int iVar1;
  deUint32 dVar2;
  StructType *this_02;
  BufferBlock *this_03;
  int ndx;
  long lVar3;
  VarType local_a0;
  Random rnd;
  VarType local_48;
  
  this_01 = &(this->super_SSBOLayoutCase).m_interface;
  this_02 = bb::ShaderInterface::allocStruct(this_01,"S");
  glu::VarType::VarType((VarType *)&rnd,TYPE_UINT_VEC2,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"a",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  glu::VarType::VarType(&local_a0,TYPE_FLOAT_MAT2X4,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&rnd,&local_a0,4);
  glu::StructType::addMember(this_02,"b",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType((VarType *)&rnd,TYPE_FLOAT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"c",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  this_03 = bb::ShaderInterface::allocBlock(this_01,"Block");
  glu::VarType::VarType(&local_a0,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  bb::BufferVar::BufferVar((BufferVar *)&rnd,"u",&local_a0,0);
  this_00 = &this_03->m_variables;
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,(value_type *)&rnd);
  bb::BufferVar::~BufferVar((BufferVar *)&rnd);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType(&local_a0,TYPE_UINT,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar((BufferVar *)&rnd,"v",&local_a0,0x1000);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,(value_type *)&rnd);
  bb::BufferVar::~BufferVar((BufferVar *)&rnd);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::VarType(&local_48,this_02);
  glu::VarType::VarType(&local_a0,&local_48,-1);
  bb::BufferVar::BufferVar((BufferVar *)&rnd,"s",&local_a0,0x1800);
  std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::push_back
            (this_00,(value_type *)&rnd);
  bb::BufferVar::~BufferVar((BufferVar *)&rnd);
  glu::VarType::~VarType(&local_a0);
  glu::VarType::~VarType(&local_48);
  this_03->m_flags = this->m_layoutFlags;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::assign((char *)&this_03->m_instanceName);
    bb::BufferBlock::setArraySize(this_03,this->m_numInstances);
  }
  deRandom_init(&rnd.m_rnd,0xf6);
  for (lVar3 = 0; iVar1 = this->m_numInstances + (uint)(this->m_numInstances == 0), lVar3 < iVar1;
      lVar3 = lVar3 + 1) {
    dVar2 = deRandom_getUint32(&rnd.m_rnd);
    (this_03->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar3] = dVar2 % 5 + 1;
  }
  return iVar1;
}

Assistant:

void init (void)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_UINT_VEC2, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT2X4, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC3, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("u", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("v", VarType(glu::TYPE_UINT, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		block.addMember(BufferVar("s", VarType(VarType(&typeS), VarType::UNSIZED_ARRAY), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		{
			de::Random rnd(246);
			for (int ndx = 0; ndx < (m_numInstances ? m_numInstances : 1); ndx++)
			{
				const int lastArrayLen = rnd.getInt(1, 5);
				block.setLastUnsizedArraySize(ndx, lastArrayLen);
			}
		}
	}